

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.cpp:174:37)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_function_object_cpp:174:37)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  function_object *this_00;
  bound_function_args *this_01;
  vector<mjs::value,_std::allocator<mjs::value>_> vStack_38;
  
  this_00 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  this_01 = (bound_function_args *)
            gc_heap_ptr_untyped::get(&(this->f).bound_args.super_gc_heap_ptr_untyped);
  bound_function_args::build_args(&vStack_38,this_01,args);
  function_object::construct(__return_storage_ptr__,this_00,(value *)&value::undefined,&vStack_38);
  std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&vStack_38);
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }